

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1b8a13::CAPIExternalCommand::processMakefileDiscoveredDependencies
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          string *depsPath,bool ignoreSubsequentOutputs)

{
  TaskInterface ti_00;
  bool bVar1;
  undefined8 uVar2;
  FileSystem *pFVar3;
  BuildSystemDelegate *pBVar4;
  size_t sVar5;
  pointer this_00;
  error_code eVar6;
  StringRef SVar7;
  MakefileDepsParser local_1240;
  char *local_1220;
  void *local_1210;
  void *local_1208;
  undefined1 local_1200 [8];
  DepsActions actions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  undefined8 local_1178;
  StringRef local_1168;
  string local_1158;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_1138;
  int local_1130;
  error_category *local_1128;
  Twine local_1120;
  Twine local_1108;
  Twine local_10f0;
  Twine local_10d8;
  StringRef local_10c0;
  undefined1 local_10b0 [8];
  SmallString<4096U> absPath;
  Twine local_98;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_80;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> input;
  bool ignoreSubsequentOutputs_local;
  string *depsPath_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  CAPIExternalCommand *this_local;
  TaskInterface ti_local;
  
  input._M_t.super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl._7_1_ = ignoreSubsequentOutputs;
  std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>::
  unique_ptr<std::default_delete<llvm::MemoryBuffer>,void>
            ((unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>> *)&local_80);
  llvm::Twine::Twine(&local_98,depsPath);
  bVar1 = llvm::sys::path::is_absolute(&local_98,native);
  if (bVar1) {
    pFVar3 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    (*pFVar3->_vptr_FileSystem[4])
              (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
               InlineElts + 0xff8,pFVar3,depsPath);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator=
              (&local_80,
               (unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
               (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                InlineElts + 0xff8));
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              ((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
               (absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                InlineElts + 0xff8));
  }
  else {
    uVar2 = std::__cxx11::string::data();
    local_10c0.Data = (char *)uVar2;
    uVar2 = std::__cxx11::string::length();
    local_10c0.Length = uVar2;
    llvm::SmallString<4096U>::SmallString((SmallString<4096U> *)local_10b0,local_10c0);
    llvm::Twine::Twine(&local_10d8,depsPath);
    llvm::Twine::Twine(&local_10f0,"");
    llvm::Twine::Twine(&local_1108,"");
    llvm::Twine::Twine(&local_1120,"");
    llvm::sys::path::append
              ((SmallVectorImpl<char> *)local_10b0,&local_10d8,&local_10f0,&local_1108,&local_1120);
    eVar6 = llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)local_10b0);
    local_1128 = eVar6._M_cat;
    local_1130 = eVar6._M_value;
    pFVar3 = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    local_1168 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_10b0);
    llvm::StringRef::operator_cast_to_string(&local_1158,&local_1168);
    (*pFVar3->_vptr_FileSystem[4])(&local_1138,pFVar3,&local_1158);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::operator=
              (&local_80,&local_1138);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              (&local_1138);
    std::__cxx11::string::~string((string *)&local_1158);
    llvm::SmallString<4096U>::~SmallString((SmallString<4096U> *)local_10b0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_80);
  if (bVar1) {
    local_1210 = ti.impl;
    local_1208 = ti.ctx;
    local_1220 = (char *)std::__cxx11::string::data();
    sVar5 = std::__cxx11::string::length();
    ti_00.ctx = local_1208;
    ti_00.impl = local_1210;
    SVar7.Length = sVar5;
    SVar7.Data = local_1220;
    (anonymous_namespace)::CAPIExternalCommand::processMakefileDiscoveredDependencies(llbuild::
    buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,std::
    __cxx11::string,bool)::DepsActions::DepsActions(llbuild::buildsystem::BuildSystem&,llbuild::core
    ::TaskInterface,(anonymous_namespace)::CAPIExternalCommand*,llvm::StringRef_
              (local_1200,system,ti_00,this,SVar7);
    this_00 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
              operator->(&local_80);
    SVar7 = llvm::MemoryBuffer::getBuffer(this_00);
    llbuild::core::MakefileDepsParser::MakefileDepsParser
              (&local_1240,SVar7,(ParseActions *)local_1200,
               (bool)(input._M_t.
                      super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                      .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl._7_1_ & 1));
    llbuild::core::MakefileDepsParser::parse(&local_1240);
    ti_local.ctx._7_1_ = (int)actions.depsPath.Length == 0;
    actions._60_4_ = 1;
    processMakefileDiscoveredDependencies::DepsActions::~DepsActions((DepsActions *)local_1200);
  }
  else {
    pBVar4 = llbuild::buildsystem::BuildSystem::getDelegate(system);
    std::operator+(&local_11b8,"unable to open dependencies file (",depsPath);
    std::operator+(&local_1198,&local_11b8,")");
    local_1178 = std::__cxx11::string::data();
    uVar2 = std::__cxx11::string::length();
    (*pBVar4->_vptr_BuildSystemDelegate[0xb])(pBVar4,this,local_1178,uVar2);
    std::__cxx11::string::~string((string *)&local_1198);
    std::__cxx11::string::~string((string *)&local_11b8);
    ti_local.ctx._7_1_ = false;
    actions._60_4_ = 1;
  }
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&local_80);
  return ti_local.ctx._7_1_;
}

Assistant:

bool processMakefileDiscoveredDependencies(BuildSystem& system,
                                             core::TaskInterface ti,
                                             QueueJobContext* context,
                                             std::string depsPath,
                                             bool ignoreSubsequentOutputs) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }
    
    // Parse the output.
    //
    // We just ignore the rule, and add any dependency that we encounter in the
    // file.
    struct DepsActions : public core::MakefileDepsParser::ParseActions {
      BuildSystem& system;
      core::TaskInterface ti;
      CAPIExternalCommand* command;
      StringRef depsPath;
      unsigned numErrors{0};
      
      DepsActions(BuildSystem& system,
                  core::TaskInterface ti,
                  CAPIExternalCommand* command, StringRef depsPath)
      : system(system), ti(ti), command(command), depsPath(depsPath) {}
      
      virtual void error(StringRef message, uint64_t position) override {
        system.getDelegate().commandHadError(command, "error reading dependency file '" + depsPath.str() + "': " + std::string(message));
        ++numErrors;
      }
      
      virtual void actOnRuleDependency(StringRef dependency,
                                       StringRef unescapedWord) override {
        if (llvm::sys::path::is_absolute(unescapedWord)) {
          ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
          system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
          return;
        }

        // Generate absolute path
        //
        // NOTE: This is making the assumption that relative paths coming in a
        // dependency file are in relation to the explictly set working
        // directory, or the current working directory when it has not been set.
        SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
        llvm::sys::path::append(absPath, unescapedWord);
        llvm::sys::fs::make_absolute(absPath);

        ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
      }

      virtual void actOnRuleStart(StringRef name,
                                  const StringRef unescapedWord) override {}

      virtual void actOnRuleEnd() override {}
    };
    
    DepsActions actions(system, ti, this, depsPath);
    core::MakefileDepsParser(input->getBuffer(), actions, ignoreSubsequentOutputs).parse();
    return actions.numErrors == 0;
  }